

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

TaskExecutionResult __thiscall
duckdb::HashAggregateDistinctFinalizeTask::AggregateDistinctGrouping
          (HashAggregateDistinctFinalizeTask *this,idx_t grouping_idx)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var1;
  pointer puVar2;
  pointer puVar3;
  HashAggregateGlobalSinkState *pHVar4;
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var5;
  ClientContext *context;
  pointer pVVar6;
  bool bVar7;
  SourceResultType SVar8;
  type pDVar9;
  const_reference pvVar10;
  reference this_01;
  type pDVar11;
  Event *pEVar12;
  const_reference this_02;
  pointer pEVar13;
  BoundAggregateExpression *pBVar14;
  mapped_type *pmVar15;
  reference this_03;
  type sink_p;
  pointer pRVar16;
  type pLVar17;
  const_reference this_04;
  const_reference this_05;
  reference this_06;
  pointer this_07;
  reference this_08;
  type this_09;
  reference this_10;
  BoundReferenceExpression *pBVar18;
  reference pvVar19;
  reference pvVar20;
  type lstate_p;
  vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
  *this_11;
  PhysicalHashAggregate *pPVar21;
  TaskExecutionResult TVar22;
  size_type sVar23;
  idx_t group_idx;
  size_type sVar24;
  idx_t child_idx;
  ulong uVar25;
  initializer_list<unsigned_long> __l;
  allocator_type local_2b1;
  idx_t *local_2b0;
  type local_2a8;
  unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> *local_2a0;
  const_reference local_298;
  type local_290;
  unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
  *local_288;
  size_type *local_280;
  reference local_278;
  ExecutionContext execution_context;
  idx_t local_220;
  DataChunk group_chunk;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1d8;
  __weak_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> local_1c0 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  OperatorSourceInput source_input;
  OperatorSinkInput sink_input;
  DataChunk output_chunk;
  DataChunk aggregate_input_chunk;
  InterruptState interrupt_state;
  ThreadContext thread_context;
  
  pDVar9 = unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>,_true>
           ::operator*(&this->op->distinct_collection_info);
  pvVar10 = vector<duckdb::HashAggregateGroupingData,_true>::get<true>
                      (&this->op->groupings,grouping_idx);
  this_01 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::get<true>
                      (&this->gstate->grouping_states,grouping_idx);
  pDVar11 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
            ::operator*(&this_01->distinct_state);
  local_298 = pvVar10;
  local_2a8 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
              ::operator*(&pvVar10->distinct_data);
  this_00 = pDVar9->aggregates;
  ThreadContext::ThreadContext(&thread_context,((this->super_ExecutorTask).executor)->context);
  execution_context.pipeline.ptr = this->pipeline;
  execution_context.client = ((this->super_ExecutorTask).executor)->context;
  execution_context.thread = &thread_context;
  enable_shared_from_this<duckdb::Task>::shared_from_this
            ((enable_shared_from_this<duckdb::Task> *)&group_chunk);
  ::std::__weak_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<duckdb::Task,void>
            (local_1c0,(__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> *)&group_chunk);
  InterruptState::InterruptState(&interrupt_state,(weak_ptr<duckdb::Task,_true> *)local_1c0);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_1b8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &group_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish);
  local_290 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              ::operator*(&this_01->table_state);
  local_2a0 = &this->local_sink_state;
  if ((this->local_sink_state).
      super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
      super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
      .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl == (LocalSinkState *)0x0)
  {
    RadixPartitionedHashTable::GetLocalSinkState
              ((RadixPartitionedHashTable *)&group_chunk,(ExecutionContext *)local_298);
    pVVar6 = group_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    group_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _Var1._M_head_impl =
         (local_2a0->
         super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
         .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
    (local_2a0->
    super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
    super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)pVVar6;
    if ((_Var1._M_head_impl != (LocalSinkState *)0x0) &&
       ((**(code **)((long)(_Var1._M_head_impl)->_vptr_LocalSinkState + 8))(),
       group_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0)) {
      (**(code **)(*(long *)group_chunk.data.
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  sink_input.global_state = local_290;
  sink_input.local_state =
       unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
       operator*(local_2a0);
  sink_input.interrupt_state = &interrupt_state;
  DataChunk::DataChunk(&group_chunk);
  pPVar21 = this->op;
  if ((pPVar21->input_group_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pPVar21->input_group_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    DataChunk::Initialize
              (&group_chunk,((this->super_ExecutorTask).executor)->context,
               &pPVar21->input_group_types,0x800);
    pPVar21 = this->op;
  }
  puVar2 = (pPVar21->grouped_aggregate_data).groups.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (pPVar21->grouped_aggregate_data).groups.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  DataChunk::DataChunk(&aggregate_input_chunk);
  pHVar4 = this->gstate;
  if ((pHVar4->payload_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pHVar4->payload_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    DataChunk::Initialize
              (&aggregate_input_chunk,((this->super_ExecutorTask).executor)->context,
               &pHVar4->payload_types,0x800);
  }
  pEVar12 = shared_ptr<duckdb::Event,_true>::operator->(&(this->super_ExecutorTask).event);
  sVar23 = (long)puVar2 - (long)puVar3 >> 3;
  local_2b0 = &this->aggregation_idx;
  this_11 = &local_2a8->radix_tables;
  local_288 = &this->radix_table_lstate;
  sVar24 = this->aggregation_idx;
  do {
    if ((ulong)((long)(this->op->grouped_aggregate_data).aggregates.
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->op->grouped_aggregate_data).aggregates.
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= sVar24) {
      lstate_p = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                 ::operator*(local_2a0);
      RadixPartitionedHashTable::Combine
                (&local_298->table_data,&execution_context,local_290,lstate_p);
      TVar22 = TASK_FINISHED;
LAB_0198a0ee:
      DataChunk::~DataChunk(&aggregate_input_chunk);
      DataChunk::~DataChunk(&group_chunk);
      InterruptState::~InterruptState(&interrupt_state);
      ThreadContext::~ThreadContext(&thread_context);
      return TVar22;
    }
    this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(this_00,sVar24);
    pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_02);
    pBVar14 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar13->super_BaseExpression)
    ;
    if (this->blocked == false) {
      this->payload_idx = this->next_payload_idx;
      this->next_payload_idx =
           ((long)(pBVar14->children).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pBVar14->children).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) + this->next_payload_idx;
    }
    bVar7 = DistinctAggregateData::IsDistinct(local_2a8,*local_2b0);
    if (bVar7) {
      pmVar15 = ::std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&local_2a8->info->table_map,local_2b0);
      local_278 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                  ::get<true>(this_11,*pmVar15);
      local_280 = pmVar15;
      this_03 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                ::get<true>(&pDVar11->radix_states,*pmVar15);
      sink_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
               ::operator*(this_03);
      if (this->blocked == false) {
        pRVar16 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                  ::operator->(local_278);
        RadixPartitionedHashTable::GetLocalSourceState
                  ((RadixPartitionedHashTable *)&output_chunk,(ExecutionContext *)pRVar16);
        pVVar6 = output_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        output_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        _Var5._M_head_impl =
             (local_288->
             super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
             .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
        (local_288->
        super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
        .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl =
             (LocalSourceState *)pVVar6;
        if ((_Var5._M_head_impl != (LocalSourceState *)0x0) &&
           ((*(_Var5._M_head_impl)->_vptr_LocalSourceState[1])(),
           output_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start != (pointer)0x0)) {
          (**(code **)(*(long *)output_chunk.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
      pLVar17 = unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
                ::operator*(local_288);
      this_04 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>,_true>
                ::get<true>((vector<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>,_true>
                             *)&pEVar12[1].total_tasks,grouping_idx);
      this_05 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                ::get<true>(this_04,*local_2b0);
      source_input.global_state =
           unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
           ::operator*(this_05);
      source_input.interrupt_state = &interrupt_state;
      source_input.local_state = pLVar17;
      DataChunk::DataChunk(&output_chunk);
      context = ((this->super_ExecutorTask).executor)->context;
      this_06 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                ::get<true>(&pDVar11->distinct_output_chunks,*local_280);
      this_07 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                operator->(this_06);
      DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_1d8,this_07);
      DataChunk::Initialize
                (&output_chunk,context,(vector<duckdb::LogicalType,_true> *)&local_1d8,0x800);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1d8);
      while( true ) {
        DataChunk::Reset(&output_chunk);
        DataChunk::Reset(&group_chunk);
        DataChunk::Reset(&aggregate_input_chunk);
        pRVar16 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                  ::operator->(local_278);
        SVar8 = RadixPartitionedHashTable::GetData
                          (pRVar16,&execution_context,&output_chunk,sink_p,&source_input);
        if (SVar8 == FINISHED) break;
        if (SVar8 == BLOCKED) {
          this->blocked = true;
          DataChunk::~DataChunk(&output_chunk);
          TVar22 = TASK_BLOCKED;
          goto LAB_0198a0ee;
        }
        this_08 = vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                  ::get<true>(&local_2a8->grouped_aggregate_data,*local_280);
        this_09 = unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>
                  ::operator*(this_08);
        for (sVar24 = 0; sVar23 != sVar24; sVar24 = sVar24 + 1) {
          this_10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::get<true>(&this_09->groups,sVar24);
          pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(this_10);
          pBVar18 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                              (&pEVar13->super_BaseExpression);
          pvVar19 = vector<duckdb::Vector,_true>::get<true>(&group_chunk.data,pBVar18->index);
          pvVar20 = vector<duckdb::Vector,_true>::get<true>
                              ((vector<duckdb::Vector,_true> *)&output_chunk,sVar24);
          Vector::Reference(pvVar19,pvVar20);
        }
        group_chunk.count = output_chunk.count;
        for (uVar25 = 0;
            uVar25 < ((long)(this_09->groups).
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_09->groups).
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) - sVar23;
            uVar25 = uVar25 + 1) {
          pvVar19 = vector<duckdb::Vector,_true>::get<true>
                              (&aggregate_input_chunk.data,this->payload_idx + uVar25);
          pvVar20 = vector<duckdb::Vector,_true>::get<true>
                              ((vector<duckdb::Vector,_true> *)&output_chunk,uVar25 + sVar23);
          Vector::Reference(pvVar19,pvVar20);
        }
        aggregate_input_chunk.count = output_chunk.count;
        local_220 = *local_2b0;
        __l._M_len = 1;
        __l._M_array = &local_220;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1d8,__l,
                   &local_2b1);
        RadixPartitionedHashTable::Sink
                  (&local_298->table_data,&execution_context,&group_chunk,&sink_input,
                   &aggregate_input_chunk,(unsafe_vector<idx_t> *)&local_1d8);
        ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1d8);
      }
      this->blocked = false;
      DataChunk::~DataChunk(&output_chunk);
    }
    sVar24 = *local_2b0 + 1;
    *local_2b0 = sVar24;
  } while( true );
}

Assistant:

TaskExecutionResult HashAggregateDistinctFinalizeTask::AggregateDistinctGrouping(const idx_t grouping_idx) {
	D_ASSERT(op.distinct_collection_info);
	auto &info = *op.distinct_collection_info;

	auto &grouping_data = op.groupings[grouping_idx];
	auto &grouping_state = gstate.grouping_states[grouping_idx];
	D_ASSERT(grouping_state.distinct_state);
	auto &distinct_state = *grouping_state.distinct_state;
	auto &distinct_data = *grouping_data.distinct_data;

	auto &aggregates = info.aggregates;

	// Thread-local contexts
	ThreadContext thread_context(executor.context);
	ExecutionContext execution_context(executor.context, thread_context, &pipeline);

	// Sink state to sink into global HTs
	InterruptState interrupt_state(shared_from_this());
	auto &global_sink_state = *grouping_state.table_state;
	if (!local_sink_state) {
		local_sink_state = grouping_data.table_data.GetLocalSinkState(execution_context);
	}
	OperatorSinkInput sink_input {global_sink_state, *local_sink_state, interrupt_state};

	// Create a chunk that mimics the 'input' chunk in Sink, for storing the group vectors
	DataChunk group_chunk;
	if (!op.input_group_types.empty()) {
		group_chunk.Initialize(executor.context, op.input_group_types);
	}

	const idx_t group_by_size = op.grouped_aggregate_data.groups.size();

	DataChunk aggregate_input_chunk;
	if (!gstate.payload_types.empty()) {
		aggregate_input_chunk.Initialize(executor.context, gstate.payload_types);
	}

	const auto &finalize_event = event->Cast<HashAggregateDistinctFinalizeEvent>();

	auto &agg_idx = aggregation_idx;
	for (; agg_idx < op.grouped_aggregate_data.aggregates.size(); agg_idx++) {
		auto &aggregate = aggregates[agg_idx]->Cast<BoundAggregateExpression>();

		if (!blocked) {
			// Forward the payload idx
			payload_idx = next_payload_idx;
			next_payload_idx = payload_idx + aggregate.children.size();
		}

		// If aggregate is not distinct, skip it
		if (!distinct_data.IsDistinct(agg_idx)) {
			continue;
		}

		D_ASSERT(distinct_data.info.table_map.count(agg_idx));
		const auto &table_idx = distinct_data.info.table_map.at(agg_idx);
		auto &radix_table = distinct_data.radix_tables[table_idx];

		auto &sink = *distinct_state.radix_states[table_idx];
		if (!blocked) {
			radix_table_lstate = radix_table->GetLocalSourceState(execution_context);
		}
		auto &local_source = *radix_table_lstate;
		OperatorSourceInput source_input {*finalize_event.global_source_states[grouping_idx][agg_idx], local_source,
		                                  interrupt_state};

		// Create a duplicate of the output_chunk, because of multi-threading we cant alter the original
		DataChunk output_chunk;
		output_chunk.Initialize(executor.context, distinct_state.distinct_output_chunks[table_idx]->GetTypes());

		// Fetch all the data from the aggregate ht, and Sink it into the main ht
		while (true) {
			output_chunk.Reset();
			group_chunk.Reset();
			aggregate_input_chunk.Reset();

			auto res = radix_table->GetData(execution_context, output_chunk, sink, source_input);
			if (res == SourceResultType::FINISHED) {
				D_ASSERT(output_chunk.size() == 0);
				break;
			} else if (res == SourceResultType::BLOCKED) {
				blocked = true;
				return TaskExecutionResult::TASK_BLOCKED;
			}

			auto &grouped_aggregate_data = *distinct_data.grouped_aggregate_data[table_idx];
			for (idx_t group_idx = 0; group_idx < group_by_size; group_idx++) {
				auto &group = grouped_aggregate_data.groups[group_idx];
				auto &bound_ref_expr = group->Cast<BoundReferenceExpression>();
				group_chunk.data[bound_ref_expr.index].Reference(output_chunk.data[group_idx]);
			}
			group_chunk.SetCardinality(output_chunk);

			for (idx_t child_idx = 0; child_idx < grouped_aggregate_data.groups.size() - group_by_size; child_idx++) {
				aggregate_input_chunk.data[payload_idx + child_idx].Reference(
				    output_chunk.data[group_by_size + child_idx]);
			}
			aggregate_input_chunk.SetCardinality(output_chunk);

			// Sink it into the main ht
			grouping_data.table_data.Sink(execution_context, group_chunk, sink_input, aggregate_input_chunk, {agg_idx});
		}
		blocked = false;
	}
	grouping_data.table_data.Combine(execution_context, global_sink_state, *local_sink_state);
	return TaskExecutionResult::TASK_FINISHED;
}